

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pareto_dist.hpp
# Opt level: O2

result_type_conflict2 __thiscall
trng::pareto_dist<double>::icdf(pareto_dist<double> *this,result_type_conflict2 x)

{
  int *piVar1;
  double dVar2;
  result_type_conflict2 rVar3;
  
  rVar3 = 0.0;
  if ((x <= 0.0) || (1.0 <= x)) {
    piVar1 = __errno_location();
    *piVar1 = 0x21;
    rVar3 = NAN;
  }
  else if ((x != 0.0) || (NAN(x))) {
    if ((x != 1.0) || (NAN(x))) {
      dVar2 = pow(1.0 - x,-1.0 / (this->P).gamma_);
      rVar3 = (dVar2 + -1.0) * (this->P).theta_;
    }
    else {
      rVar3 = INFINITY;
    }
  }
  return rVar3;
}

Assistant:

result_type icdf(result_type x) const {
      if (x <= 0 or x >= 1) {
#if !(defined TRNG_CUDA)
        errno = EDOM;
#endif
        return math::numeric_limits<result_type>::quiet_NaN();
      }
      if (x == 0)
        return 0;
      if (x == 1)
        return math::numeric_limits<result_type>::infinity();
      return (math::pow((1 - x), -1 / P.gamma()) - 1) * P.theta();
    }